

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition>::relocate
          (QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition> *this,
          qsizetype offset,PositionalArgumentDefinition **data)

{
  PositionalArgumentDefinition *d_first;
  PositionalArgumentDefinition *pPVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QCommandLineParserPrivate::PositionalArgumentDefinition,long_long>
            (this->ptr,this->size,d_first);
  if (data != (PositionalArgumentDefinition **)0x0) {
    pPVar1 = *data;
    if ((this->ptr <= pPVar1) && (pPVar1 < this->ptr + this->size)) {
      *data = pPVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }